

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

iterator __thiscall QList<QOcspResponse>::end(QList<QOcspResponse> *this)

{
  detach(this);
  return (iterator)((this->d).ptr + (this->d).size * 8);
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }